

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_utils.cpp
# Opt level: O0

void HydroUtils::ComputeFluxes
               (Box *bx,Array4<double> *fx,Array4<double> *fy,Array4<double> *fz,
               Array4<const_double> *umac,Array4<const_double> *vmac,Array4<const_double> *wmac,
               Array4<const_double> *xed,Array4<const_double> *yed,Array4<const_double> *zed,
               Geometry *geom,int ncomp,bool fluxes_are_area_weighted)

{
  void *in_RCX;
  void *in_RDX;
  void *in_RSI;
  undefined8 *in_RDI;
  void *in_R8;
  void *in_R9;
  void *in_stack_00000008;
  void *in_stack_00000010;
  void *in_stack_00000018;
  void *in_stack_00000020;
  CoordSys *in_stack_00000028;
  byte in_stack_00000038;
  Box bx_3;
  Box *zbx;
  Box bx_2;
  Box *ybx;
  Box bx_1;
  Box *xbx;
  GpuArray<double,_3U> area;
  GpuArray<double,_3U> dx;
  undefined1 local_560 [8];
  anon_class_216_4_ac3311dc *in_stack_fffffffffffffaa8;
  int in_stack_fffffffffffffab4;
  Box *in_stack_fffffffffffffab8;
  undefined1 auStack_520 [64];
  undefined1 auStack_4e0 [64];
  undefined8 local_4a0;
  undefined8 local_498;
  undefined8 local_490;
  undefined8 local_484;
  undefined8 local_47c;
  undefined8 local_474;
  uint local_46c;
  undefined8 *local_468;
  undefined1 local_460 [64];
  undefined1 auStack_420 [64];
  undefined1 auStack_3e0 [64];
  undefined8 local_3a0;
  undefined8 local_398;
  undefined8 local_390;
  undefined8 local_384;
  undefined8 local_37c;
  undefined8 local_374;
  uint local_36c;
  undefined8 *local_368;
  undefined1 local_360 [64];
  undefined1 auStack_320 [64];
  undefined1 auStack_2e0 [64];
  undefined8 local_2a0;
  undefined8 local_298;
  undefined8 local_290;
  undefined8 local_284;
  undefined8 local_27c;
  undefined8 local_274;
  uint local_26c;
  undefined8 *local_268;
  undefined8 local_260;
  undefined8 local_258;
  undefined8 local_250;
  GpuArray<double,_3U> local_248;
  byte local_229;
  void *local_228;
  void *local_220;
  void *local_218;
  void *local_210;
  void *local_208;
  undefined8 *local_200;
  undefined4 local_1f4;
  GpuArray<double,_3U> *local_1f0;
  undefined4 local_1e4;
  GpuArray<double,_3U> *local_1e0;
  undefined4 local_1d4;
  GpuArray<double,_3U> *local_1d0;
  undefined4 local_1c4;
  GpuArray<double,_3U> *local_1c0;
  undefined4 local_1b4;
  GpuArray<double,_3U> *local_1b0;
  undefined4 local_1a4;
  GpuArray<double,_3U> *local_1a0;
  undefined4 local_194;
  undefined8 *local_190;
  undefined4 local_184;
  undefined8 *local_180;
  undefined4 local_174;
  undefined8 *local_170;
  undefined4 local_164;
  undefined8 *local_160;
  undefined4 local_154;
  undefined8 *local_150;
  undefined4 local_144;
  undefined8 *local_140;
  undefined4 local_134;
  undefined8 *local_130;
  undefined4 local_124;
  undefined8 *local_120;
  undefined4 local_114;
  undefined8 *local_110;
  undefined4 local_104;
  undefined8 *local_100;
  undefined4 local_f4;
  undefined8 *local_f0;
  undefined4 local_e4;
  undefined8 *local_e0;
  undefined4 local_d4;
  uint *local_d0;
  undefined4 local_c4;
  uint *local_c0;
  undefined4 local_b4;
  uint *local_b0;
  undefined4 local_a8;
  undefined4 local_a4;
  long local_a0;
  undefined4 local_98;
  undefined4 local_94;
  long local_90;
  undefined4 local_88;
  undefined4 local_84;
  long local_80;
  undefined4 local_74;
  uint *local_70;
  undefined4 local_64;
  uint *local_60;
  undefined4 local_54;
  uint *local_50;
  undefined4 local_44;
  uint *local_40;
  undefined4 local_34;
  uint *local_30;
  undefined4 local_24;
  uint *local_20;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  undefined4 local_8;
  undefined4 local_4;
  
  local_229 = in_stack_00000038 & 1;
  local_228 = in_R9;
  local_220 = in_R8;
  local_218 = in_RCX;
  local_210 = in_RDX;
  local_208 = in_RSI;
  local_200 = in_RDI;
  amrex::CoordSys::CellSizeArray(&local_248,in_stack_00000028);
  if ((local_229 & 1) == 0) {
    local_170 = &local_260;
    local_174 = 0;
    local_180 = &local_260;
    local_184 = 1;
    local_190 = &local_260;
    local_194 = 2;
  }
  else {
    local_1a0 = &local_248;
    local_1a4 = 1;
    local_1b0 = &local_248;
    local_1b4 = 2;
    local_140 = &local_260;
    local_144 = 0;
    local_1c0 = &local_248;
    local_1c4 = 0;
    local_1d0 = &local_248;
    local_1d4 = 2;
    local_150 = &local_260;
    local_154 = 1;
    local_1e0 = &local_248;
    local_1e4 = 0;
    local_1f0 = &local_248;
    local_1f4 = 1;
    local_160 = &local_260;
    local_164 = 2;
  }
  local_110 = local_200;
  local_114 = 0;
  local_284 = *local_200;
  local_27c = local_200[1];
  local_274 = local_200[2];
  local_26c = *(uint *)(local_200 + 3);
  local_100 = &local_284;
  local_104 = 0;
  local_b0 = &local_26c;
  local_b4 = 0;
  local_44 = 0;
  local_10 = 0;
  if ((local_26c & 1) == 0) {
    local_80 = (long)&local_27c + 4;
    local_84 = 0;
    local_88 = 1;
    local_50 = &local_26c;
    local_54 = 0;
    local_c = 0;
    local_26c = local_26c | 1;
  }
  local_268 = &local_284;
  local_40 = local_b0;
  memcpy(local_360,local_208,0x3c);
  memcpy(auStack_320,local_220,0x3c);
  memcpy(auStack_2e0,in_stack_00000010,0x3c);
  local_2a0 = local_260;
  local_298 = local_258;
  local_290 = local_250;
  amrex::
  ParallelFor<int,HydroUtils::ComputeFluxes(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Geometry_const&,int,bool)::__0,void>
            (in_stack_fffffffffffffab8,in_stack_fffffffffffffab4,in_stack_fffffffffffffaa8);
  local_120 = local_200;
  local_124 = 1;
  local_384 = *local_200;
  local_37c = local_200[1];
  local_374 = local_200[2];
  local_36c = *(uint *)(local_200 + 3);
  local_f0 = &local_384;
  local_f4 = 1;
  local_c0 = &local_36c;
  local_c4 = 1;
  local_34 = 1;
  local_14 = 1;
  if ((local_36c & 2) == 0) {
    local_90 = (long)&local_37c + 4;
    local_94 = 1;
    local_98 = 1;
    local_60 = &local_36c;
    local_64 = 1;
    local_8 = 1;
    local_36c = local_36c | 2;
  }
  local_368 = &local_384;
  local_30 = local_c0;
  memcpy(local_460,local_210,0x3c);
  memcpy(auStack_420,local_228,0x3c);
  memcpy(auStack_3e0,in_stack_00000018,0x3c);
  local_3a0 = local_260;
  local_398 = local_258;
  local_390 = local_250;
  amrex::
  ParallelFor<int,HydroUtils::ComputeFluxes(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Geometry_const&,int,bool)::__1,void>
            (in_stack_fffffffffffffab8,in_stack_fffffffffffffab4,
             (anon_class_216_4_ade8d339 *)in_stack_fffffffffffffaa8);
  local_130 = local_200;
  local_134 = 2;
  local_484 = *local_200;
  local_47c = local_200[1];
  local_474 = local_200[2];
  local_46c = *(uint *)(local_200 + 3);
  local_e0 = &local_484;
  local_e4 = 2;
  local_d0 = &local_46c;
  local_d4 = 2;
  local_24 = 2;
  local_18 = 2;
  if ((local_46c & 4) == 0) {
    local_a0 = (long)&local_47c + 4;
    local_a4 = 2;
    local_a8 = 1;
    local_70 = &local_46c;
    local_74 = 2;
    local_4 = 2;
    local_46c = local_46c | 4;
  }
  local_468 = &local_484;
  local_20 = local_d0;
  memcpy(local_560,local_218,0x3c);
  memcpy(auStack_520,in_stack_00000008,0x3c);
  memcpy(auStack_4e0,in_stack_00000020,0x3c);
  local_4a0 = local_260;
  local_498 = local_258;
  local_490 = local_250;
  amrex::
  ParallelFor<int,HydroUtils::ComputeFluxes(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Geometry_const&,int,bool)::__2,void>
            (in_stack_fffffffffffffab8,in_stack_fffffffffffffab4,
             (anon_class_216_4_af9e9496 *)in_stack_fffffffffffffaa8);
  return;
}

Assistant:

void
HydroUtils::ComputeFluxes ( Box const& bx,
                            AMREX_D_DECL( Array4<Real> const& fx,
                                          Array4<Real> const& fy,
                                          Array4<Real> const& fz),
                            AMREX_D_DECL( Array4<Real const> const& umac,
                                          Array4<Real const> const& vmac,
                                          Array4<Real const> const& wmac),
                            AMREX_D_DECL( Array4<Real const> const& xed,
                                          Array4<Real const> const& yed,
                                          Array4<Real const> const& zed),
                            Geometry const& geom, const int ncomp,
                            const bool fluxes_are_area_weighted )
{
#if (AMREX_SPACEDIM == 2)
    if (geom.IsRZ()) {
        // Need metrics when using RZ
        Array<FArrayBox,AMREX_SPACEDIM> area;
        Array<Elixir,AMREX_SPACEDIM> area_eli;
        if (fluxes_are_area_weighted) {
            for (int dir = 0; dir < AMREX_SPACEDIM; ++dir)
            {
                const int ngrow_area = 0;
                geom.GetFaceArea(area[dir],BoxArray(bx),0,dir,ngrow_area);
                area_eli[dir] = area[dir].elixir();
            }
        }
        const auto& ax = (fluxes_are_area_weighted) ? area[0].const_array()
                                                    : Array4<const Real>{};
        const auto& ay = (fluxes_are_area_weighted) ? area[1].const_array()
                                                    : Array4<const Real>{};
        //
        //  X flux
        //
        const Box& xbx = amrex::surroundingNodes(bx,0);
        amrex::ParallelFor(xbx, ncomp, [fx, umac, xed, ax, fluxes_are_area_weighted]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            if (fluxes_are_area_weighted) {
                fx(i,j,k,n) = xed(i,j,k,n) * umac(i,j,k) * ax(i,j,k);
            } else {
                fx(i,j,k,n) = xed(i,j,k,n) * umac(i,j,k);
            }
        });

        //
        //  Y flux
        //
        const Box& ybx = amrex::surroundingNodes(bx,1);
        amrex::ParallelFor(ybx, ncomp, [fy, vmac, yed, ay, fluxes_are_area_weighted]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            if (fluxes_are_area_weighted) {
                fy(i,j,k,n) = yed(i,j,k,n) * vmac(i,j,k) * ay(i,j,k);
            } else {
                fy(i,j,k,n) = yed(i,j,k,n) * vmac(i,j,k);
            }
        });
    } else
#endif
    {
        const auto dx = geom.CellSizeArray();

        GpuArray<Real,AMREX_SPACEDIM> area;
#if ( AMREX_SPACEDIM == 3 )
        if (fluxes_are_area_weighted) {
            area[0] = dx[1]*dx[2];
            area[1] = dx[0]*dx[2];
            area[2] = dx[0]*dx[1];
        } else {
            area[0] = 1.; area[1] = 1.; area[2] = 1.;
        }
#else
        if (fluxes_are_area_weighted) {
            area[0] = dx[1];
            area[1] = dx[0];
        } else {
            area[0] = 1.; area[1] = 1.;
        }
#endif

        //
        //  X flux
        //
        const Box& xbx = amrex::surroundingNodes(bx,0);
        amrex::ParallelFor(xbx, ncomp, [fx, umac, xed, area]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            fx(i,j,k,n) = xed(i,j,k,n) * umac(i,j,k) * area[0];
        });

        //
        //  Y flux
        //
        const Box& ybx = amrex::surroundingNodes(bx,1);
        amrex::ParallelFor(ybx, ncomp, [fy, vmac, yed, area]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            fy(i,j,k,n) = yed(i,j,k,n) * vmac(i,j,k) * area[1];
        });

#if ( AMREX_SPACEDIM == 3 )
        //
        //  Z flux
        //
        const Box& zbx = amrex::surroundingNodes(bx,2);
        amrex::ParallelFor(zbx, ncomp, [fz, wmac, zed, area]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            fz(i,j,k,n) = zed(i,j,k,n) * wmac(i,j,k) * area[2];
        });
#endif
    }

}